

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O1

void __thiscall
MODEL3D::three_dim_model::build_layer_box
          (three_dim_model *this,int *layer_number,IntPoint *a,IntPoint *b,IntPoint *c,IntPoint *d,
          geofile *generated_geofile)

{
  int iVar1;
  void *pvVar2;
  IntPoint *pIVar3;
  ulong uVar4;
  three_dim_model *ptVar5;
  mapped_type *pmVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_> lines_map;
  map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  points_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> plane_surfaces_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  curve_loops_map;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> volumes_map;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  surface_loops_map;
  geofile base_shape;
  allocator_type local_431;
  vector<int,_std::allocator<int>_> local_430;
  uint local_414;
  undefined1 local_410 [12];
  undefined4 uStack_404;
  pointer local_400;
  pointer local_3f8;
  double local_3f0;
  pointer local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  IntPoint *local_3c8;
  IntPoint *local_3c0;
  ulong local_3b8;
  IntPoint *local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  ulong local_398;
  ulong local_390;
  ulong local_388;
  uint local_37c;
  uint local_378;
  int local_374;
  int local_370;
  uint local_36c;
  three_dim_model *local_368;
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  local_360;
  uint local_330;
  uint local_32c;
  uint local_328;
  int local_324;
  int local_320;
  int local_31c;
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  local_318;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_2e8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_2b8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_288;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_258;
  geofile local_228;
  
  local_3c8 = b;
  local_3c0 = c;
  pmVar6 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  iVar1 = pmVar6->z_start;
  pmVar6 = std::
           map<int,_MODEL3D::Layer_prop,_std::less<int>,_std::allocator<std::pair<const_int,_MODEL3D::Layer_prop>_>_>
           ::operator[](&this->proc_info_map,layer_number);
  local_3a8 = CONCAT44(local_3a8._4_4_,pmVar6->thickness);
  GEO::geofile::geofile(&local_228);
  GEO::geofile::switch_to_OpenCASCADE(&local_228);
  local_318._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318._M_impl.super__Rb_tree_header._M_header;
  local_318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_360._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_360._M_impl.super__Rb_tree_header._M_header;
  local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2e8._M_impl.super__Rb_tree_header._M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_258._M_impl.super__Rb_tree_header._M_header;
  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288._M_impl.super__Rb_tree_header._M_header;
  local_288._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_288._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar8 = this->pnt_cnt;
  local_390 = (ulong)(uint)this->ln_cnt;
  local_3b8 = (ulong)(uint)this->ps_cnt;
  local_3e0 = (ulong)(uint)this->cl_cnt;
  local_370 = this->sl_cnt;
  local_374 = this->vol_cnt;
  unique0x100003be = (pointer)(double)a->X;
  local_400 = (pointer)(double)a->Y;
  local_3f8 = (pointer)(double)iVar1;
  local_3f0 = this->model_default_char_length;
  local_410._0_4_ = uVar8 + 1;
  local_3d8 = (ulong)(uint)local_410._0_4_;
  local_414 = iVar1;
  local_3e8 = local_3f8;
  local_360._M_impl.super__Rb_tree_header._M_header._M_right =
       local_360._M_impl.super__Rb_tree_header._M_header._M_left;
  local_318._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_288._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288._M_impl.super__Rb_tree_header._M_header._M_left;
  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  pIVar3 = local_3c8;
  unique0x100003c6 = (pointer)(double)local_3c8->X;
  local_400 = (pointer)(double)local_3c8->Y;
  local_3f0 = this->model_default_char_length;
  local_410._0_4_ = uVar8 + 2;
  local_388 = (ulong)(uint)local_410._0_4_;
  local_3f8 = local_3e8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  unique0x100003d6 = (pointer)(double)local_3c0->X;
  local_400 = (pointer)(double)local_3c0->Y;
  local_3f0 = this->model_default_char_length;
  local_410._0_4_ = uVar8 + 3;
  local_398 = (ulong)(uint)local_410._0_4_;
  local_3f8 = local_3e8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  unique0x100003e6 = (pointer)(double)d->X;
  local_400 = (pointer)(double)d->Y;
  local_3f0 = this->model_default_char_length;
  local_410._0_4_ = uVar8 + 4;
  local_3a0 = (ulong)(uint)local_410._0_4_;
  local_3f8 = local_3e8;
  local_3d0 = (ulong)uVar8;
  local_3b0 = d;
  local_368 = this;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  iVar1 = (int)local_390;
  local_410._0_4_ = iVar1 + 1;
  iVar11 = (int)local_388;
  iVar13 = (int)local_3d8;
  local_410._4_4_ = (int)local_3d8;
  local_410._8_4_ = (int)local_388;
  local_36c = local_410._0_4_;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 2;
  iVar9 = (int)local_398;
  local_410._4_4_ = iVar11;
  local_410._8_4_ = (int)local_398;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar1 + 3;
  iVar11 = (int)local_3a0;
  local_410._4_4_ = iVar9;
  local_410._8_4_ = (int)local_3a0;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_410._4_4_ = iVar11;
  local_410._8_4_ = iVar13;
  local_410._0_4_ = iVar1 + 4U;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  uVar8 = local_414;
  local_330 = (uint)local_3d8;
  local_32c = (uint)local_388;
  local_328 = (uint)local_398;
  local_324 = (int)local_3a0;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_330;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l,&local_431);
  ptVar5 = local_368;
  local_410._0_4_ = (int)local_3e0 + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar10 = (int)local_3b8 + 1;
  local_410._0_4_ = uVar10;
  local_410._4_4_ = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  unique0x100003f6 = (pointer)(double)a->X;
  local_400 = (pointer)(double)a->Y;
  local_3f8 = (pointer)(double)(int)((int)local_3a8 + uVar8);
  local_3f0 = ptVar5->model_default_char_length;
  iVar13 = (int)local_3d0;
  local_414 = iVar13 + 5;
  local_410._0_4_ = local_414;
  local_3e8 = local_3f8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  unique0x100003fe = (pointer)(double)pIVar3->X;
  local_400 = (pointer)(double)pIVar3->Y;
  local_3f0 = ptVar5->model_default_char_length;
  local_410._0_4_ = iVar13 + 6;
  local_3c8 = (IntPoint *)CONCAT44(local_3c8._4_4_,local_410._0_4_);
  local_3f8 = local_3e8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  unique0x1000040e = (pointer)(double)local_3c0->X;
  local_400 = (pointer)(double)local_3c0->Y;
  local_3f0 = ptVar5->model_default_char_length;
  uVar7 = iVar13 + 7;
  local_3f8 = local_3e8;
  local_410._0_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  unique0x1000041e = (pointer)(double)local_3b0->X;
  local_400 = (pointer)(double)local_3b0->Y;
  local_3f0 = ptVar5->model_default_char_length;
  local_410._0_4_ = iVar13 + 8;
  local_3d0 = (ulong)(uint)local_410._0_4_;
  local_3f8 = local_3e8;
  local_37c = uVar10;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
  ::_M_insert_unique<std::pair<int_const,GEO::point>>
            ((_Rb_tree<int,std::pair<int_const,GEO::point>,std::_Select1st<std::pair<int_const,GEO::point>>,std::less<int>,std::allocator<std::pair<int_const,GEO::point>>>
              *)&local_318,(pair<const_int,_GEO::point> *)local_410);
  uVar8 = local_414;
  iVar13 = (int)local_390;
  local_410._0_4_ = iVar13 + 5;
  uVar10 = (uint)local_3c8;
  local_410._4_4_ = local_414;
  local_410._8_4_ = (uint)local_3c8;
  local_378 = iVar1 + 4U;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar13 + 6;
  local_3c0 = (IntPoint *)CONCAT44(local_3c0._4_4_,local_410._0_4_);
  local_3e8 = (pointer)((ulong)uVar7 << 0x20);
  local_410._4_4_ = uVar10;
  local_410._8_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar13 + 7;
  local_3b0 = (IntPoint *)CONCAT44(local_3b0._4_4_,local_410._0_4_);
  iVar1 = (int)local_3d0;
  local_3a8 = local_3d0 << 0x20;
  local_410._8_4_ = (int)local_3d0;
  local_410._4_4_ = uVar7;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_410._0_4_ = iVar13 + 8;
  local_410._4_4_ = iVar1;
  local_410._8_4_ = uVar8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_330 = local_414;
  local_32c = (uint)local_3c8;
  local_324 = (int)local_3d0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_330;
  local_328 = uVar7;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l_00,&local_431);
  local_410._0_4_ = (int)local_3e0 + 2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  uVar4 = local_3b8;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar13 = (int)uVar4 + 2;
  local_410._0_4_ = iVar13;
  local_410._4_4_ = iVar13;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  iVar1 = (int)local_390;
  local_414 = iVar1 + 9;
  local_410._8_4_ = uVar8 | (uint)(local_3d8 >> 0x20);
  local_410._4_4_ = (undefined4)local_3d8;
  local_410._0_4_ = local_414;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  uVar8 = iVar1 + 10;
  local_410._8_4_ = uVar10 | (uint)(local_388 >> 0x20);
  local_410._4_4_ = (undefined4)local_388;
  local_410._0_4_ = uVar8;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_330 = local_36c;
  local_328 = -5 - iVar1;
  local_324 = -9 - iVar1;
  __l_01._M_len = 4;
  __l_01._M_array = (iterator)&local_330;
  local_32c = uVar8;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l_01,&local_431);
  local_410._0_4_ = (int)local_3e0 + 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  local_3d8 = CONCAT44(local_3d8._4_4_,iVar13);
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar13 = (int)uVar4 + 3;
  local_410._0_4_ = iVar13;
  local_410._4_4_ = iVar13;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_410._4_4_ = (undefined4)((ulong)local_3e8 | local_398);
  local_410._8_4_ = (undefined4)(((ulong)local_3e8 | local_398) >> 0x20);
  local_410._0_4_ = iVar1 + 0xbU;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_32c = local_3c0._0_4_;
  local_328 = -0xb - iVar1;
  local_324 = -2 - iVar1;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_330;
  local_330 = uVar8;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l_02,&local_431);
  local_410._0_4_ = (int)local_3e0 + 4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar11 = (int)local_3b8 + 4;
  local_410._0_4_ = iVar11;
  local_410._4_4_ = iVar11;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_410._4_4_ = (undefined4)(local_3a8 | local_3a0);
  local_410._8_4_ = (undefined4)((local_3a8 | local_3a0) >> 0x20);
  local_410._0_4_ = iVar1 + 0xc;
  std::
  _Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
  ::_M_insert_unique<std::pair<int_const,GEO::line>>
            ((_Rb_tree<int,std::pair<int_const,GEO::line>,std::_Select1st<std::pair<int_const,GEO::line>>,std::less<int>,std::allocator<std::pair<int_const,GEO::line>>>
              *)&local_360,(pair<const_int,_GEO::line> *)local_410);
  local_32c = local_3b0._0_4_;
  local_324 = -3 - iVar1;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_330;
  local_330 = iVar1 + 0xbU;
  local_328 = -0xc - iVar1;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l_03,&local_431);
  local_410._0_4_ = (int)local_3e0 + 5;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  uVar4 = local_3b8;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,iVar1 + 0xc);
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar9 = (int)uVar4 + 5;
  local_410._0_4_ = iVar9;
  local_410._4_4_ = iVar9;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_330 = local_378;
  local_32c = local_414;
  local_328 = -8 - iVar1;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_330;
  local_324 = -0xc - iVar1;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l_04,&local_431);
  local_410._0_4_ = (int)local_3e0 + 6;
  local_3e0 = (ulong)(uint)local_410._0_4_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_2b8,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar12 = (int)uVar4 + 6;
  local_410._0_4_ = iVar12;
  local_410._4_4_ = iVar12;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_2e8,(pair<const_int,_int> *)local_410);
  local_330 = local_37c;
  local_32c = (int)local_3d8;
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)&local_330;
  local_328 = iVar13;
  local_324 = iVar11;
  local_320 = iVar9;
  local_31c = iVar12;
  std::vector<int,_std::allocator<int>_>::vector(&local_430,__l_05,&local_431);
  iVar13 = local_370 + 1;
  local_410._0_4_ = iVar13;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_410 + 8),&local_430);
  ptVar5 = local_368;
  iVar1 = local_374;
  std::
  _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
  ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
            ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
              *)&local_258,(pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_410);
  pvVar2 = (void *)CONCAT44(uStack_404,local_410._8_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_3f8 - (long)pvVar2);
  }
  if (local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_430.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_410._0_4_ = iVar1 + 1;
  local_410._4_4_ = iVar13;
  std::
  _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
  ::_M_insert_unique<std::pair<int_const,int>>
            ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              *)&local_288,(pair<const_int,_int> *)local_410);
  GEO::geofile::insert_points_map
            (&local_228,
             (map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
              *)&local_318);
  GEO::geofile::insert_lines_map
            (&local_228,
             (map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
              *)&local_360);
  GEO::geofile::insert_curve_loops_map
            (&local_228,
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_2b8);
  GEO::geofile::insert_plane_surfaces_map
            (&local_228,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_2e8);
  GEO::geofile::insert_surface_loops_map
            (&local_228,
             (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              *)&local_258);
  GEO::geofile::insert_volumes_map
            (&local_228,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             &local_288);
  GEO::geofile::disable_char_len(&local_228);
  generated_geofile->mesh_spacing = local_228.mesh_spacing;
  (generated_geofile->start_time).__d.__r = (rep)local_228.start_time.__d.__r;
  generated_geofile->is_open_cascade = local_228.is_open_cascade;
  generated_geofile->ignore_char_len = local_228.ignore_char_len;
  generated_geofile->bool_diff_rest = local_228.bool_diff_rest;
  *(undefined5 *)&generated_geofile->field_0xb = local_228._11_5_;
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  ::operator=(&(generated_geofile->points_map)._M_t,&local_228.points_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  ::operator=(&(generated_geofile->lines_map)._M_t,&local_228.lines_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->curve_loops_map)._M_t,&local_228.curve_loops_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(generated_geofile->plane_surfaces_map)._M_t,&local_228.plane_surfaces_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->surface_loops_map)._M_t,&local_228.surface_loops_map._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(generated_geofile->volumes_map)._M_t,&local_228.volumes_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_points_map)._M_t,&local_228.physical_points_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_curves_map)._M_t,&local_228.physical_curves_map._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_surfaces_map)._M_t,&local_228.physical_surfaces_map._M_t
             );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::operator=(&(generated_geofile->physical_volumes_map)._M_t,&local_228.physical_volumes_map._M_t);
  ptVar5->pnt_cnt = (int)local_3d0;
  ptVar5->ln_cnt = (int)local_3e8;
  ptVar5->cl_cnt = (int)local_3e0;
  ptVar5->ps_cnt = iVar12;
  ptVar5->sl_cnt = iVar13;
  ptVar5->vol_cnt = iVar1 + 1;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_288);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_258);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_2e8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_2b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::line>,_std::_Select1st<std::pair<const_int,_GEO::line>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
  ::~_Rb_tree(&local_360);
  std::
  _Rb_tree<int,_std::pair<const_int,_GEO::point>,_std::_Select1st<std::pair<const_int,_GEO::point>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
  ::~_Rb_tree(&local_318);
  GEO::geofile::~geofile(&local_228);
  return;
}

Assistant:

void MODEL3D::three_dim_model::build_layer_box(
 const int &layer_number,
const ClipperLib::IntPoint &a,
const ClipperLib::IntPoint &b,
const ClipperLib::IntPoint &c,
const ClipperLib::IntPoint &d,
GEO::geofile &generated_geofile )
{
    int base_height = proc_info_map[layer_number].z_start;
    int thickness = proc_info_map[layer_number].thickness;
    GEO::geofile base_shape;
    base_shape.switch_to_OpenCASCADE();
    std::map<int, GEO::point> points_map;
    std::map<int, GEO::line> lines_map;
    std::map<int, std::vector<int>> curve_loops_map;
    std::map<int, int> plane_surfaces_map;
    std::map<int, std::vector<int>> surface_loops_map;
    std::map<int, int> volumes_map;
    GEO::point one, two, three, four, five, six, seven, eight;
    int point_count = pnt_cnt;
    int line_count = ln_cnt;
    int plane_sur_count = ps_cnt;
    int cur_loop_count = cl_cnt;
    int sur_loop_count = sl_cnt;
    int vol_count = vol_cnt;
    //------- bottom --------
    one.x   = a.X;
    one.y   = a.Y;
    one.z   = base_height;
    one.char_len = model_default_char_length;
    points_map.insert({++point_count, one});
    two.x   = b.X;
    two.y   = b.Y;
    two.z   = base_height;
    two.char_len = model_default_char_length;
    points_map.insert({++point_count, two});
    three.x = c.X;
    three.y = c.Y;
    three.z = base_height;
    three.char_len = model_default_char_length;
    points_map.insert({++point_count, three});
    four.x  = d.X;
    four.y  = d.Y;
    four.z  = base_height;
    four.char_len = model_default_char_length;
    points_map.insert({++point_count, four});
    GEO::line in_line;
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {(point_count-3), (point_count-2), (point_count-1), point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    //-------- top ---------
    five.x   = a.X;
    five.y   = a.Y;
    five.z   = base_height + thickness;
    five.char_len = model_default_char_length;
    points_map.insert({++point_count, five});
    six.x    = b.X;
    six.y    = b.Y;
    six.z    = base_height + thickness;
    six.char_len = model_default_char_length;
    points_map.insert({++point_count, six});
    seven.x  = c.X;
    seven.y  = c.Y;
    seven.z  = base_height + thickness;
    seven.char_len = model_default_char_length;
    points_map.insert({++point_count, seven});
    eight.x  = d.X;
    eight.y  = d.Y;
    eight.z  = base_height + thickness;
    eight.char_len = model_default_char_length;
    points_map.insert({++point_count, eight});
    in_line.start = point_count-3;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-2;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-1;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {point_count-3,point_count-2,point_count-1,point_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 1;
    in_line.start = point_count-7;
    in_line.end = point_count-3;
    lines_map.insert({++line_count, in_line});
    in_line.start = point_count-6;
    in_line.end = point_count-2;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-9,line_count,-(line_count-5),-(line_count-1)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 2;
    in_line.start = point_count-5;
    in_line.end = point_count-1;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 3;
    in_line.start = point_count-4;
    in_line.end = point_count;
    lines_map.insert({++line_count, in_line});
    curve_loops_map.insert({++cur_loop_count, {line_count-1,line_count-5,-line_count,-(line_count-9)}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // side 4;
    curve_loops_map.insert({++cur_loop_count, {line_count-8,line_count-3,-(line_count-4),-line_count}});
    plane_surfaces_map.insert({++plane_sur_count, plane_sur_count});
    // enclose
    surface_loops_map.insert({++sur_loop_count, {plane_sur_count-5,plane_sur_count-4,
                                                 plane_sur_count-3,plane_sur_count-2,
                                                 plane_sur_count-1, plane_sur_count}});
    volumes_map.insert({++vol_count, sur_loop_count});
    base_shape.insert_points_map(points_map);
    base_shape.insert_lines_map(lines_map);
    base_shape.insert_curve_loops_map(curve_loops_map);
    base_shape.insert_plane_surfaces_map(plane_surfaces_map);
    base_shape.insert_surface_loops_map(surface_loops_map);
    base_shape.insert_volumes_map(volumes_map);
    base_shape.disable_char_len();
    generated_geofile = base_shape;
    pnt_cnt = point_count;
    ln_cnt = line_count;
    cl_cnt = cur_loop_count;
    ps_cnt = plane_sur_count;
    sl_cnt = sur_loop_count;
    vol_cnt = vol_count;
    // std::string output_path = "data/3DGen/" +
    // std::to_string(layer_number) + "_P_0.geo";
    // base_shape.export_geofile(output_path); //For debugging
    // __asm("nop");
}